

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

ll_node * ll_last(ll_node *node)

{
  ll_node *plVar1;
  
  if (node != (ll_node *)0x0) {
    do {
      plVar1 = node;
      node = node->next;
    } while (node != (ll_node *)0x0);
    return plVar1;
  }
  return (ll_node *)0x0;
}

Assistant:

struct ll_node *ll_last(struct ll_node *node)
{
	if (node == NULL) {
		return NULL;
	}
	struct ll_node *cur_node = (struct ll_node *)node;
	while (cur_node->next != NULL) {
		cur_node = cur_node->next;
	}
	return cur_node;
}